

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidGetPotentialChildren(xmlElementContent *ctree,xmlChar **names,int *len,int max)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  if (len == (int *)0x0 || (names == (xmlChar **)0x0 || ctree == (xmlElementContent *)0x0)) {
    return -1;
  }
  if (max <= *len) {
    return *len;
  }
  switch(ctree->type) {
  case XML_ELEMENT_CONTENT_PCDATA:
    iVar1 = *len;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        iVar1 = xmlStrEqual((xmlChar *)"#PCDATA",names[lVar3]);
        if (iVar1 != 0) goto switchD_0015b20a_default;
        lVar3 = lVar3 + 1;
        iVar1 = *len;
      } while (lVar3 < iVar1);
    }
    *len = iVar1 + 1;
    pcVar2 = "#PCDATA";
    break;
  case XML_ELEMENT_CONTENT_ELEMENT:
    iVar1 = *len;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        iVar1 = xmlStrEqual(ctree->name,names[lVar3]);
        if (iVar1 != 0) goto switchD_0015b20a_default;
        lVar3 = lVar3 + 1;
        iVar1 = *len;
      } while (lVar3 < iVar1);
    }
    pcVar2 = (char *)ctree->name;
    *len = iVar1 + 1;
    break;
  case XML_ELEMENT_CONTENT_SEQ:
  case XML_ELEMENT_CONTENT_OR:
    xmlValidGetPotentialChildren(ctree->c1,names,len,max);
    xmlValidGetPotentialChildren(ctree->c2,names,len,max);
  default:
    goto switchD_0015b20a_default;
  }
  names[iVar1] = (xmlChar *)pcVar2;
switchD_0015b20a_default:
  return *len;
}

Assistant:

int
xmlValidGetPotentialChildren(xmlElementContent *ctree,
                             const xmlChar **names,
                             int *len, int max) {
    int i;

    if ((ctree == NULL) || (names == NULL) || (len == NULL))
        return(-1);
    if (*len >= max) return(*len);

    switch (ctree->type) {
	case XML_ELEMENT_CONTENT_PCDATA:
	    for (i = 0; i < *len;i++)
		if (xmlStrEqual(BAD_CAST "#PCDATA", names[i])) return(*len);
	    names[(*len)++] = BAD_CAST "#PCDATA";
	    break;
	case XML_ELEMENT_CONTENT_ELEMENT:
	    for (i = 0; i < *len;i++)
		if (xmlStrEqual(ctree->name, names[i])) return(*len);
	    names[(*len)++] = ctree->name;
	    break;
	case XML_ELEMENT_CONTENT_SEQ:
	    xmlValidGetPotentialChildren(ctree->c1, names, len, max);
	    xmlValidGetPotentialChildren(ctree->c2, names, len, max);
	    break;
	case XML_ELEMENT_CONTENT_OR:
	    xmlValidGetPotentialChildren(ctree->c1, names, len, max);
	    xmlValidGetPotentialChildren(ctree->c2, names, len, max);
	    break;
   }

   return(*len);
}